

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O0

GLenum __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::getTextureGLTarget(TextureSizeCase *this)

{
  TextureSizeCase *this_local;
  
  switch(this->m_type) {
  case TEXTURE_FLOAT_2D:
    this_local._4_4_ = 0x9100;
    break;
  case TEXTURE_FLOAT_2D_ARRAY:
    this_local._4_4_ = 0x9102;
    break;
  case TEXTURE_INT_2D:
    this_local._4_4_ = 0x9100;
    break;
  case TEXTURE_INT_2D_ARRAY:
    this_local._4_4_ = 0x9102;
    break;
  case TEXTURE_UINT_2D:
    this_local._4_4_ = 0x9100;
    break;
  case TEXTURE_UINT_2D_ARRAY:
    this_local._4_4_ = 0x9102;
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLenum TextureSizeCase::getTextureGLTarget (void)
{
	switch (m_type)
	{
		case TEXTURE_FLOAT_2D:			return GL_TEXTURE_2D_MULTISAMPLE;
		case TEXTURE_FLOAT_2D_ARRAY:	return GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
		case TEXTURE_INT_2D:			return GL_TEXTURE_2D_MULTISAMPLE;
		case TEXTURE_INT_2D_ARRAY:		return GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
		case TEXTURE_UINT_2D:			return GL_TEXTURE_2D_MULTISAMPLE;
		case TEXTURE_UINT_2D_ARRAY:		return GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}